

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::TestRegistry::getMatchingTestCases
          (TestRegistry *this,string *rawTestSpec,
          vector<Catch::TestCaseInfo,_std::allocator<Catch::TestCaseInfo>_> *matchingTestsOut)

{
  pointer pTVar1;
  bool bVar2;
  pointer testCase;
  TestCaseFilter filter;
  TestCaseFilter TStack_48;
  
  TestCaseFilter::TestCaseFilter(&TStack_48,rawTestSpec,AutoDetectBehaviour);
  pTVar1 = (this->m_functionsInOrder).
           super__Vector_base<Catch::TestCaseInfo,_std::allocator<Catch::TestCaseInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (testCase = (this->m_functionsInOrder).
                  super__Vector_base<Catch::TestCaseInfo,_std::allocator<Catch::TestCaseInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start; testCase != pTVar1;
      testCase = testCase + 1) {
    bVar2 = TestCaseFilter::shouldInclude(&TStack_48,testCase);
    if (bVar2) {
      std::vector<Catch::TestCaseInfo,_std::allocator<Catch::TestCaseInfo>_>::push_back
                (matchingTestsOut,testCase);
    }
  }
  std::__cxx11::string::~string((string *)&TStack_48);
  return;
}

Assistant:

virtual void getMatchingTestCases( const std::string& rawTestSpec, std::vector<TestCaseInfo>& matchingTestsOut ) const {
            TestCaseFilter filter( rawTestSpec );

            std::vector<TestCaseInfo>::const_iterator it = m_functionsInOrder.begin();
            std::vector<TestCaseInfo>::const_iterator itEnd = m_functionsInOrder.end();
            for(; it != itEnd; ++it ) {
                if( filter.shouldInclude( *it ) ) {
                    matchingTestsOut.push_back( *it );
                }
            }
        }